

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O3

int updatewindow(z_streamp strm,Bytef *end,uint copy)

{
  uint uVar1;
  internal_state *piVar2;
  void *__dest;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  piVar2 = strm->state;
  __dest = *(void **)&piVar2->method;
  if (__dest == (void *)0x0) {
    __dest = (*strm->zalloc)(strm->opaque,1 << (*(byte *)&piVar2->gzhead & 0x1f),1);
    *(void **)&piVar2->method = __dest;
    if (__dest == (voidpf)0x0) {
      return 1;
    }
  }
  uVar4 = *(uint *)((long)&piVar2->gzhead + 4);
  if (uVar4 == 0) {
    uVar4 = 1 << (*(byte *)&piVar2->gzhead & 0x1f);
    *(uint *)((long)&piVar2->gzhead + 4) = uVar4;
    piVar2->gzindex = 0;
  }
  if (copy < uVar4) {
    uVar1 = *(uint *)((long)&piVar2->gzindex + 4);
    uVar4 = uVar4 - uVar1;
    uVar5 = copy;
    if (uVar4 < copy) {
      uVar5 = uVar4;
    }
    memcpy((void *)((long)__dest + (ulong)uVar1),end + -(ulong)copy,(ulong)uVar5);
    if (copy <= uVar4) {
      uVar3 = *(int *)((long)&piVar2->gzindex + 4) + uVar5;
      uVar4 = *(uint *)((long)&piVar2->gzhead + 4);
      uVar1 = (uint)piVar2->gzindex;
      if (uVar3 == uVar4) {
        uVar3 = 0;
      }
      *(uint *)((long)&piVar2->gzindex + 4) = uVar3;
      if (uVar4 <= uVar1) {
        return 0;
      }
      *(uint *)&piVar2->gzindex = uVar1 + uVar5;
      return 0;
    }
    uVar5 = copy - uVar5;
    memcpy(*(void **)&piVar2->method,end + -(ulong)uVar5,(ulong)uVar5);
    *(uint *)((long)&piVar2->gzindex + 4) = uVar5;
  }
  else {
    memcpy(__dest,end + -(ulong)uVar4,(ulong)uVar4);
    *(undefined4 *)((long)&piVar2->gzindex + 4) = 0;
  }
  *(undefined4 *)&piVar2->gzindex = *(undefined4 *)((long)&piVar2->gzhead + 4);
  return 0;
}

Assistant:

local int updatewindow(z_streamp strm, const Bytef *end, unsigned copy) {
    struct inflate_state FAR *state;
    unsigned dist;

    state = (struct inflate_state FAR *)strm->state;

    /* if it hasn't been done already, allocate space for the window */
    if (state->window == Z_NULL) {
        state->window = (unsigned char FAR *)
                        ZALLOC(strm, 1U << state->wbits,
                               sizeof(unsigned char));
        if (state->window == Z_NULL) return 1;
    }

    /* if window not in use yet, initialize */
    if (state->wsize == 0) {
        state->wsize = 1U << state->wbits;
        state->wnext = 0;
        state->whave = 0;
    }

    /* copy state->wsize or less output bytes into the circular window */
    if (copy >= state->wsize) {
        zmemcpy(state->window, end - state->wsize, state->wsize);
        state->wnext = 0;
        state->whave = state->wsize;
    }
    else {
        dist = state->wsize - state->wnext;
        if (dist > copy) dist = copy;
        zmemcpy(state->window + state->wnext, end - copy, dist);
        copy -= dist;
        if (copy) {
            zmemcpy(state->window, end - copy, copy);
            state->wnext = copy;
            state->whave = state->wsize;
        }
        else {
            state->wnext += dist;
            if (state->wnext == state->wsize) state->wnext = 0;
            if (state->whave < state->wsize) state->whave += dist;
        }
    }
    return 0;
}